

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

HashWriter * __thiscall
HashWriter::operator<<(HashWriter *this,vector<bool,_std::allocator<bool>_> *obj)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  int iVar4;
  ulong *puVar5;
  long in_FS_OFFSET;
  uchar local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<HashWriter>
            (this,(ulong)(obj->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)(obj->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)(obj->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  puVar5 = (obj->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (obj->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (obj->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (puVar5 != puVar2 || uVar1 != 0) {
    uVar3 = 0;
    do {
      local_39 = (*puVar5 >> (uVar3 & 0x3f) & 1) != 0;
      CSHA256::Write(&this->ctx,&local_39,1);
      iVar4 = (int)uVar3;
      uVar3 = (ulong)(iVar4 + 1);
      if (iVar4 == 0x3f) {
        uVar3 = 0;
      }
      puVar5 = puVar5 + (iVar4 == 0x3f);
    } while ((uint)uVar3 != uVar1 || puVar5 != puVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

HashWriter& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return *this;
    }